

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O2

void immutable::rrb_details::ensure_internal_editable<int,false,6>
               (ref<immutable::rrb_details::internal_node<int,_false>_> *internal,guid_type guid)

{
  internal_node<int,_false> *piVar1;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_18;
  
  piVar1 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(internal);
  if (piVar1->guid != guid) {
    local_18.ptr = transient_internal_node_clone<int,false,6>(internal->ptr,guid);
    if (local_18.ptr != (internal_node<int,_false> *)0x0) {
      (local_18.ptr)->_ref_count = 1;
    }
    ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(internal,&local_18);
    ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_18);
  }
  return;
}

Assistant:

inline void ensure_internal_editable(ref<internal_node<T, atomic_ref_counting>>& internal, guid_type guid)
      {
      if (internal->guid != guid)
        {
        internal = transient_internal_node_clone<T, atomic_ref_counting, N>(internal.ptr, guid);
        }
      }